

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::mouse2_dragged(Application *this,float x,float y)

{
  float dy;
  float dx;
  float y_local;
  float x_local;
  Application *this_local;
  
  if ((*(int *)&(this->super_Renderer).field_0xc != 1) &&
     ((*(int *)&(this->super_Renderer).field_0xc != 2 || (this->action != IK)))) {
    Camera::move_by(&this->camera,(double)-(x - this->mouseX),(double)(y - this->mouseY),
                    this->canonical_view_distance);
    updateWidgets(this);
  }
  return;
}

Assistant:

void Application::mouse2_dragged(float x, float y) {
  if (mode == RENDER_MODE) return;
  if (mode == ANIMATE_MODE && action == Action::IK) return;
  float dx = (x - mouseX);
  float dy = (y - mouseY);
    // don't negate y because up is down.
  camera.move_by(-dx, dy, canonical_view_distance);


  updateWidgets();
}